

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O2

void lscpp::protocol::from_json(json *j,TextDocumentItem *p)

{
  const_reference pvVar1;
  
  pvVar1 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at<const_char_(&)[4],_0>(j,(char (*) [4])"uri");
  nlohmann::json_abi_v3_11_2::detail::
  from_json<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (pvVar1,&p->uri);
  pvVar1 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at<const_char_(&)[11],_0>(j,(char (*) [11])"languageId");
  nlohmann::json_abi_v3_11_2::detail::
  from_json<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (pvVar1,&p->languageId);
  pvVar1 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at<const_char_(&)[8],_0>(j,(char (*) [8])"version");
  nlohmann::json_abi_v3_11_2::detail::
  from_json<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
            (pvVar1,&p->version);
  pvVar1 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at<const_char_(&)[5],_0>(j,(char (*) [5])"text");
  nlohmann::json_abi_v3_11_2::detail::
  from_json<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (pvVar1,&p->text);
  return;
}

Assistant:

void from_json(const nlohmann::json &j, protocol::TextDocumentItem &p) {
  j.at("uri").get_to(p.uri);
  j.at("languageId").get_to(p.languageId);
  j.at("version").get_to(p.version);
  j.at("text").get_to(p.text);
}